

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

bool __thiscall clipp::parser::operator()(parser *this,arg_string *arg)

{
  child_t<clipp::parameter,_clipp::group> *this_00;
  bool bVar1;
  char cVar2;
  
  this->eaten_ = this->eaten_ + 1;
  this->index_ = this->index_ + 1;
  if ((this->pos_).pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->pos_).pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return false;
  }
  if ((this->blocked_ == false) && (bVar1 = try_match(this,arg), bVar1)) {
    return true;
  }
  bVar1 = try_match_blocked(this,arg);
  if (bVar1) {
    return false;
  }
  if (((this->blocked_ == false) &&
      (bVar1 = detail::scoped_dfs_traverser::matched(&this->pos_), !bVar1)) &&
     (bVar1 = group::child_t<clipp::parameter,_clipp::group>::required
                        ((this->pos_).pos_.stack_.
                         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current), bVar1)) {
    this_00 = (this->pos_).pos_.stack_.
              super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].cur._M_current;
    if (this_00->type_ == group) {
      cVar2 = group::blocking((group *)this_00);
    }
    else {
      if (this_00->type_ != param) goto LAB_00107a1c;
      cVar2 = *(bool *)((long)&this_00->m_ + 0x21);
    }
    if (cVar2 != '\0') {
      this->blocked_ = true;
    }
  }
LAB_00107a1c:
  std::vector<clipp::parser::arg_mapping,std::allocator<clipp::parser::arg_mapping>>::
  emplace_back<int&,std::__cxx11::string_const&>
            ((vector<clipp::parser::arg_mapping,std::allocator<clipp::parser::arg_mapping>> *)
             &this->args_,&this->index_,arg);
  return false;
}

Assistant:

bool operator() (const arg_string& arg)
    {
        ++eaten_;
        ++index_;

        if(!valid()) return false;

        if(!blocked_ && try_match(arg)) return true;

        if(try_match_blocked(arg)) return false;

        //skipping of blocking & required patterns is not allowed
        if(!blocked_ && !pos_.matched() && pos_->required() && pos_->blocking()) {
            blocked_ = true;
        }

        add_nomatch(arg);
        return false;
    }